

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_WahWah.cpp
# Opt level: O3

int WahWah::SetFloatParameterCallback(UnityAudioEffectState *state,int index,float value)

{
  void *pvVar1;
  
  pvVar1 = (state->field_0).field_0.effectdata;
  if (pvVar1 == (void *)0x0) {
    __assert_fail("effectdata",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/AudioPluginInterface.h"
                  ,0xfd,"T *UnityAudioEffectState::GetEffectData() const [T = WahWah::EffectData]");
  }
  if ((state->field_0).field_0.internal != (void *)0x0) {
    if (7 >= index) {
      *(float *)((long)pvVar1 + (long)index * 4) = value;
    }
    return (uint)(7 < index);
  }
  __assert_fail("internal",
                "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/AudioPluginInterface.h"
                ,0xfe,"T *UnityAudioEffectState::GetEffectData() const [T = WahWah::EffectData]");
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK SetFloatParameterCallback(UnityAudioEffectState* state, int index, float value)
    {
        EffectData::Data* data = &state->GetEffectData<EffectData>()->data;
        if (index >= P_NUM)
            return UNITY_AUDIODSP_ERR_UNSUPPORTED;
        data->p[index] = value;
        return UNITY_AUDIODSP_OK;
    }